

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O3

void __thiscall
mp::ArrayRef<char_const*>::init_from_rvalue<mp::ArrayRef<char_const*>>
          (ArrayRef<char_const*> *this,ArrayRef<const_char_*> *other)

{
  char **ppcVar1;
  size_t sVar2;
  
  if ((other->save_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (other->save_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ppcVar1 = other->data_;
    sVar2 = other->size_;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::_M_move_assign
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this);
    ppcVar1 = *(char ***)this;
    sVar2 = *(long *)(this + 8) - (long)ppcVar1 >> 3;
  }
  *(char ***)(this + 0x18) = ppcVar1;
  *(size_t *)(this + 0x20) = sVar2;
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }